

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O0

DoublePrecision pnga_wtime(void)

{
  DoublePrecision DVar1;
  double wtime;
  
  DVar1 = (DoublePrecision)MPI_Wtime();
  return DVar1;
}

Assistant:

DoublePrecision pnga_wtime() 
{
    double wtime=0.0;
#ifdef MSG_COMMS_MPI
    wtime = MPI_Wtime();
#else
    wtime = tcg_time();
#endif
    return (DoublePrecision)wtime; 
}